

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

size_t __thiscall
ylt::detail::moodycamel::
ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
::
try_dequeue_bulk<coro_io::detail::client_queue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>>::fake_iter>
          (undefined8 param_1,ProducerBase *param_2)

{
  __pointer_type this;
  size_t sVar1;
  __pointer_type ptr;
  size_t count;
  ProducerBase *itemFirst;
  
  itemFirst = (ProducerBase *)0x0;
  this = std::
         atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase_*>
         ::load((atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase_*>
                 *)param_2,relaxed);
  while( true ) {
    if (this == (__pointer_type)0x0) {
      return (size_t)itemFirst;
    }
    sVar1 = ProducerBase::
            dequeue_bulk<coro_io::detail::client_queue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>>::fake_iter>
                      (param_2,(fake_iter *)itemFirst,(size_t)this);
    itemFirst = (ProducerBase *)((long)&itemFirst->_vptr_ProducerBase + sVar1);
    if (itemFirst == param_2) break;
    this = ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
           ::ProducerBase::next_prod(this);
  }
  return (size_t)itemFirst;
}

Assistant:

size_t try_dequeue_bulk(It itemFirst, size_t max) {
    size_t count = 0;
    for (auto ptr = producerListTail.load(std::memory_order_acquire);
         ptr != nullptr; ptr = ptr->next_prod()) {
      count += ptr->dequeue_bulk(itemFirst, max - count);
      if (count == max) {
        break;
      }
    }
    return count;
  }